

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

void ctl_arena_refresh(tsdn_t *tsdn,arena_t *arena,ctl_arena_t *ctl_sdarena,uint i,_Bool destroyed)

{
  pa_shard_stats_t *ppVar1;
  pac_stats_t *ppVar2;
  locked_u64_t *plVar3;
  pac_decay_stats_t *ppVar4;
  uint64_t *puVar5;
  long *plVar6;
  size_t *psVar7;
  long *plVar8;
  long *plVar9;
  uint uVar10;
  ctl_arena_stats_t *pcVar11;
  ctl_arena_stats_t *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ctl_arena_t *pcVar18;
  size_t sVar19;
  uint64_t uVar20;
  long lVar21;
  size_t *psVar22;
  nstime_t *pnVar23;
  nstime_t *pnVar24;
  uint64_t uVar25;
  uint64_t uVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  
  pcVar18 = arenas_i((ulong)i);
  pcVar18->nthreads = 0;
  pcVar18->dss = "N/A";
  *(undefined4 *)&pcVar18->dirty_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&pcVar18->dirty_decay_ms + 4) = 0xffffffff;
  *(undefined4 *)&pcVar18->muzzy_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&pcVar18->muzzy_decay_ms + 4) = 0xffffffff;
  pcVar18->pactive = 0;
  pcVar18->pdirty = 0;
  pcVar18->pmuzzy = 0;
  switchD_0105dc25::default(pcVar18->astats,0,0x9818);
  pcVar11 = pcVar18->astats;
  duckdb_je_arena_stats_merge
            (tsdn,arena,&pcVar18->nthreads,&pcVar18->dss,&pcVar18->dirty_decay_ms,
             &pcVar18->muzzy_decay_ms,&pcVar18->pactive,&pcVar18->pdirty,&pcVar18->pmuzzy,
             &pcVar11->astats,pcVar11->bstats,pcVar11->lstats,pcVar11->estats,&pcVar11->hpastats,
             &pcVar11->secstats);
  pcVar11 = pcVar18->astats;
  sVar19 = pcVar11->allocated_small;
  uVar25 = pcVar11->nmalloc_small;
  uVar26 = pcVar11->ndalloc_small;
  uVar20 = pcVar11->nrequests_small;
  uVar27 = pcVar11->nfills_small;
  uVar28 = pcVar11->nflushes_small;
  lVar21 = 0x51c;
  psVar22 = duckdb_je_sz_index2size_tab;
  do {
    sVar19 = sVar19 + *psVar22 * *(long *)((long)pcVar11 + lVar21 * 8 + -8);
    pcVar11->allocated_small = sVar19;
    plVar6 = (long *)((long)pcVar11 + lVar21 * 8 + -0x20);
    uVar25 = uVar25 + *plVar6;
    uVar26 = uVar26 + plVar6[1];
    pcVar11->nmalloc_small = uVar25;
    pcVar11->ndalloc_small = uVar26;
    uVar20 = uVar20 + *(long *)((long)pcVar11 + lVar21 * 8 + -0x10);
    pcVar11->nrequests_small = uVar20;
    psVar7 = &(pcVar11->astats).base + lVar21;
    uVar27 = uVar27 + *psVar7;
    uVar28 = uVar28 + psVar7[1];
    pcVar11->nfills_small = uVar27;
    pcVar11->nflushes_small = uVar28;
    lVar21 = lVar21 + 0x16;
    psVar22 = psVar22 + 1;
  } while (lVar21 != 0x834);
  if (!destroyed) {
    ctl_sdarena->nthreads = ctl_sdarena->nthreads + pcVar18->nthreads;
    sVar19 = pcVar18->pdirty;
    ctl_sdarena->pactive = ctl_sdarena->pactive + pcVar18->pactive;
    ctl_sdarena->pdirty = ctl_sdarena->pdirty + sVar19;
    ctl_sdarena->pmuzzy = ctl_sdarena->pmuzzy + pcVar18->pmuzzy;
  }
  pcVar12 = ctl_sdarena->astats;
  if (!destroyed) {
    psVar22 = &(pcVar12->astats).mapped;
    *psVar22 = *psVar22 + (pcVar11->astats).mapped;
    psVar22 = &(pcVar12->astats).pa_shard_stats.pac_stats.retained;
    *psVar22 = *psVar22 + (pcVar11->astats).pa_shard_stats.pac_stats.retained;
    ppVar1 = &(pcVar12->astats).pa_shard_stats;
    ppVar1->edata_avail = ppVar1->edata_avail + (pcVar11->astats).pa_shard_stats.edata_avail;
  }
  ppVar2 = &(pcVar12->astats).pa_shard_stats.pac_stats;
  (ppVar2->decay_dirty).npurge.val.repr =
       (ppVar2->decay_dirty).npurge.val.repr +
       (pcVar11->astats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr;
  plVar3 = &(pcVar12->astats).pa_shard_stats.pac_stats.decay_dirty.nmadvise;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar11->astats).pa_shard_stats.pac_stats.decay_dirty.nmadvise.val.repr
  ;
  plVar3 = &(pcVar12->astats).pa_shard_stats.pac_stats.decay_dirty.purged;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar11->astats).pa_shard_stats.pac_stats.decay_dirty.purged.val.repr;
  ppVar4 = &(pcVar12->astats).pa_shard_stats.pac_stats.decay_muzzy;
  (ppVar4->npurge).val.repr =
       (ppVar4->npurge).val.repr +
       (pcVar11->astats).pa_shard_stats.pac_stats.decay_muzzy.npurge.val.repr;
  plVar3 = &(pcVar12->astats).pa_shard_stats.pac_stats.decay_muzzy.nmadvise;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar11->astats).pa_shard_stats.pac_stats.decay_muzzy.nmadvise.val.repr
  ;
  plVar3 = &(pcVar12->astats).pa_shard_stats.pac_stats.decay_muzzy.purged;
  (plVar3->val).repr =
       (plVar3->val).repr + (pcVar11->astats).pa_shard_stats.pac_stats.decay_muzzy.purged.val.repr;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[0].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[0].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[0].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[0].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[0].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[0].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[0].n_wait_times =
       (pcVar12->astats).mutex_prof_data[0].n_wait_times +
       (pcVar11->astats).mutex_prof_data[0].n_wait_times;
  (pcVar12->astats).mutex_prof_data[0].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[0].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[0].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[0].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[0].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[0].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[0].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[0].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[0].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[0].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[0].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[1].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[1].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[1].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[1].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[1].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[1].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[1].n_wait_times =
       (pcVar12->astats).mutex_prof_data[1].n_wait_times +
       (pcVar11->astats).mutex_prof_data[1].n_wait_times;
  (pcVar12->astats).mutex_prof_data[1].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[1].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[1].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[1].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[1].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[1].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[1].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[1].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[1].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[1].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[1].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[2].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[2].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[2].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[2].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[2].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[2].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[2].n_wait_times =
       (pcVar12->astats).mutex_prof_data[2].n_wait_times +
       (pcVar11->astats).mutex_prof_data[2].n_wait_times;
  (pcVar12->astats).mutex_prof_data[2].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[2].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[2].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[2].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[2].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[2].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[2].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[2].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[2].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[2].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[2].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[3].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[3].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[3].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[3].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[3].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[3].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[3].n_wait_times =
       (pcVar12->astats).mutex_prof_data[3].n_wait_times +
       (pcVar11->astats).mutex_prof_data[3].n_wait_times;
  (pcVar12->astats).mutex_prof_data[3].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[3].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[3].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[3].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[3].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[3].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[3].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[3].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[3].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[3].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[3].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[4].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[4].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[4].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[4].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[4].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[4].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[4].n_wait_times =
       (pcVar12->astats).mutex_prof_data[4].n_wait_times +
       (pcVar11->astats).mutex_prof_data[4].n_wait_times;
  (pcVar12->astats).mutex_prof_data[4].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[4].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[4].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[4].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[4].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[4].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[4].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[4].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[4].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[4].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[4].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[5].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[5].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[5].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[5].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[5].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[5].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[5].n_wait_times =
       (pcVar12->astats).mutex_prof_data[5].n_wait_times +
       (pcVar11->astats).mutex_prof_data[5].n_wait_times;
  (pcVar12->astats).mutex_prof_data[5].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[5].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[5].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[5].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[5].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[5].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[5].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[5].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[5].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[5].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[5].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[6].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[6].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[6].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[6].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[6].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[6].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[6].n_wait_times =
       (pcVar12->astats).mutex_prof_data[6].n_wait_times +
       (pcVar11->astats).mutex_prof_data[6].n_wait_times;
  (pcVar12->astats).mutex_prof_data[6].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[6].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[6].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[6].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[6].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[6].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[6].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[6].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[6].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[6].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[6].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[7].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[7].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[7].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[7].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[7].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[7].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[7].n_wait_times =
       (pcVar12->astats).mutex_prof_data[7].n_wait_times +
       (pcVar11->astats).mutex_prof_data[7].n_wait_times;
  (pcVar12->astats).mutex_prof_data[7].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[7].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[7].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[7].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[7].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[7].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[7].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[7].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[7].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[7].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[7].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[8].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[8].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[8].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[8].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[8].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[8].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[8].n_wait_times =
       (pcVar12->astats).mutex_prof_data[8].n_wait_times +
       (pcVar11->astats).mutex_prof_data[8].n_wait_times;
  (pcVar12->astats).mutex_prof_data[8].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[8].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[8].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[8].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[8].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[8].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[8].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[8].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[8].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[8].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[8].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[9].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[9].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[9].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[9].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[9].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[9].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[9].n_wait_times =
       (pcVar12->astats).mutex_prof_data[9].n_wait_times +
       (pcVar11->astats).mutex_prof_data[9].n_wait_times;
  (pcVar12->astats).mutex_prof_data[9].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[9].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[9].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[9].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[9].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[9].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[9].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[9].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[9].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[9].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[9].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[10].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[10].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[10].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[10].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[10].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[10].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[10].n_wait_times =
       (pcVar12->astats).mutex_prof_data[10].n_wait_times +
       (pcVar11->astats).mutex_prof_data[10].n_wait_times;
  (pcVar12->astats).mutex_prof_data[10].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[10].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[10].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[10].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[10].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[10].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[10].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[10].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[10].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[10].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[10].n_lock_ops;
  duckdb_je_nstime_add
            (&(pcVar12->astats).mutex_prof_data[0xb].tot_wait_time,
             &(pcVar11->astats).mutex_prof_data[0xb].tot_wait_time);
  pnVar23 = &(pcVar12->astats).mutex_prof_data[0xb].max_wait_time;
  pnVar24 = &(pcVar11->astats).mutex_prof_data[0xb].max_wait_time;
  iVar17 = duckdb_je_nstime_compare(pnVar23,pnVar24);
  if (iVar17 < 0) {
    duckdb_je_nstime_copy(pnVar23,pnVar24);
  }
  uVar20 = (pcVar11->astats).mutex_prof_data[0xb].n_spin_acquired;
  uVar25 = (pcVar12->astats).mutex_prof_data[0xb].n_spin_acquired;
  (pcVar12->astats).mutex_prof_data[0xb].n_wait_times =
       (pcVar12->astats).mutex_prof_data[0xb].n_wait_times +
       (pcVar11->astats).mutex_prof_data[0xb].n_wait_times;
  (pcVar12->astats).mutex_prof_data[0xb].n_spin_acquired = uVar25 + uVar20;
  uVar10 = (pcVar11->astats).mutex_prof_data[0xb].max_n_thds;
  if ((pcVar12->astats).mutex_prof_data[0xb].max_n_thds < uVar10) {
    (pcVar12->astats).mutex_prof_data[0xb].max_n_thds = uVar10;
  }
  (pcVar12->astats).mutex_prof_data[0xb].n_waiting_thds.repr =
       (pcVar11->astats).mutex_prof_data[0xb].n_waiting_thds.repr +
       (pcVar12->astats).mutex_prof_data[0xb].n_waiting_thds.repr;
  puVar5 = &(pcVar12->astats).mutex_prof_data[0xb].n_owner_switches;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[0xb].n_owner_switches;
  puVar5 = &(pcVar12->astats).mutex_prof_data[0xb].n_lock_ops;
  *puVar5 = *puVar5 + (pcVar11->astats).mutex_prof_data[0xb].n_lock_ops;
  if (!destroyed) {
    sVar19 = (pcVar11->astats).metadata_edata;
    (pcVar12->astats).base = (pcVar12->astats).base + (pcVar11->astats).base;
    (pcVar12->astats).metadata_edata = (pcVar12->astats).metadata_edata + sVar19;
    sVar19 = (pcVar11->astats).resident;
    (pcVar12->astats).metadata_rtree =
         (pcVar11->astats).metadata_rtree + (pcVar12->astats).metadata_rtree;
    (pcVar12->astats).resident = sVar19 + (pcVar12->astats).resident;
    psVar22 = &(pcVar12->astats).metadata_thp;
    *psVar22 = *psVar22 + (pcVar11->astats).metadata_thp;
    (pcVar12->astats).internal.repr =
         (pcVar11->astats).internal.repr + (pcVar12->astats).internal.repr;
    pcVar12->allocated_small = pcVar12->allocated_small + pcVar11->allocated_small;
  }
  uVar20 = pcVar11->ndalloc_small;
  pcVar12->nmalloc_small = pcVar12->nmalloc_small + pcVar11->nmalloc_small;
  pcVar12->ndalloc_small = pcVar12->ndalloc_small + uVar20;
  uVar20 = pcVar11->nfills_small;
  pcVar12->nrequests_small = pcVar11->nrequests_small + pcVar12->nrequests_small;
  pcVar12->nfills_small = uVar20 + pcVar12->nfills_small;
  pcVar12->nflushes_small = pcVar12->nflushes_small + pcVar11->nflushes_small;
  if (!destroyed) {
    psVar22 = &(pcVar12->astats).allocated_large;
    *psVar22 = *psVar22 + (pcVar11->astats).allocated_large;
  }
  uVar20 = (pcVar11->astats).ndalloc_large;
  (pcVar12->astats).nmalloc_large =
       (pcVar12->astats).nmalloc_large + (pcVar11->astats).nmalloc_large;
  (pcVar12->astats).ndalloc_large = (pcVar12->astats).ndalloc_large + uVar20;
  uVar20 = (pcVar11->astats).nrequests_large;
  (pcVar12->astats).nflushes_large =
       (pcVar11->astats).nflushes_large + (pcVar12->astats).nflushes_large;
  (pcVar12->astats).nrequests_large = uVar20 + (pcVar12->astats).nrequests_large;
  (pcVar12->astats).pa_shard_stats.pac_stats.abandoned_vm.repr =
       (pcVar11->astats).pa_shard_stats.pac_stats.abandoned_vm.repr +
       (pcVar12->astats).pa_shard_stats.pac_stats.abandoned_vm.repr;
  sVar19 = (pcVar11->astats).tcache_stashed_bytes;
  (pcVar12->astats).tcache_bytes = (pcVar12->astats).tcache_bytes + (pcVar11->astats).tcache_bytes;
  (pcVar12->astats).tcache_stashed_bytes = (pcVar12->astats).tcache_stashed_bytes + sVar19;
  if (pcVar18->arena_ind == 0) {
    (pcVar12->astats).uptime.ns = (pcVar11->astats).uptime.ns;
  }
  lVar21 = 0;
  do {
    plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.nmalloc + lVar21);
    lVar13 = plVar6[1];
    plVar8 = (long *)((long)&pcVar12->bstats[0].stats_data.nmalloc + lVar21);
    lVar14 = plVar8[1];
    plVar9 = (long *)((long)&pcVar12->bstats[0].stats_data.nmalloc + lVar21);
    *plVar9 = *plVar8 + *plVar6;
    plVar9[1] = lVar14 + lVar13;
    plVar6 = (long *)((long)&pcVar12->bstats[0].stats_data.nrequests + lVar21);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->bstats[0].stats_data.nrequests + lVar21);
    if (!destroyed) {
      plVar6 = (long *)((long)&pcVar12->bstats[0].stats_data.curregs + lVar21);
      *plVar6 = *plVar6 + *(long *)((long)&pcVar11->bstats[0].stats_data.curregs + lVar21);
    }
    plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.nfills + lVar21);
    lVar13 = plVar6[1];
    plVar8 = (long *)((long)&pcVar12->bstats[0].stats_data.nfills + lVar21);
    lVar14 = plVar8[1];
    plVar9 = (long *)((long)&pcVar12->bstats[0].stats_data.nslabs + lVar21);
    lVar15 = *plVar9;
    lVar16 = plVar9[1];
    plVar9 = (long *)((long)&pcVar12->bstats[0].stats_data.nfills + lVar21);
    *plVar9 = *plVar8 + *plVar6;
    plVar9[1] = lVar14 + lVar13;
    plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.nslabs + lVar21);
    lVar13 = plVar6[1];
    plVar8 = (long *)((long)&pcVar12->bstats[0].stats_data.nslabs + lVar21);
    *plVar8 = *plVar6 + lVar15;
    plVar8[1] = lVar13 + lVar16;
    if (!destroyed) {
      plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.curslabs + lVar21);
      lVar13 = plVar6[1];
      plVar8 = (long *)((long)&pcVar12->bstats[0].stats_data.curslabs + lVar21);
      lVar14 = plVar8[1];
      plVar9 = (long *)((long)&pcVar12->bstats[0].stats_data.curslabs + lVar21);
      *plVar9 = *plVar8 + *plVar6;
      plVar9[1] = lVar14 + lVar13;
    }
    plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.batch_pops + lVar21);
    lVar13 = plVar6[1];
    plVar8 = (long *)((long)&pcVar12->bstats[0].stats_data.batch_pops + lVar21);
    lVar14 = plVar8[1];
    plVar9 = (long *)((long)&pcVar12->bstats[0].stats_data.batch_pushes + lVar21);
    lVar15 = *plVar9;
    lVar16 = plVar9[1];
    plVar9 = (long *)((long)&pcVar12->bstats[0].stats_data.batch_pops + lVar21);
    *plVar9 = *plVar8 + *plVar6;
    plVar9[1] = lVar14 + lVar13;
    plVar6 = (long *)((long)&pcVar11->bstats[0].stats_data.batch_pushes + lVar21);
    lVar13 = plVar6[1];
    plVar8 = (long *)((long)&pcVar12->bstats[0].stats_data.batch_pushes + lVar21);
    *plVar8 = *plVar6 + lVar15;
    plVar8[1] = lVar13 + lVar16;
    duckdb_je_nstime_add
              ((nstime_t *)((long)&pcVar12->bstats[0].mutex_data.tot_wait_time.ns + lVar21),
               (nstime_t *)((long)&pcVar11->bstats[0].mutex_data.tot_wait_time.ns + lVar21));
    pnVar24 = (nstime_t *)((long)&pcVar12->bstats[0].mutex_data.max_wait_time.ns + lVar21);
    pnVar23 = (nstime_t *)((long)&pcVar11->bstats[0].mutex_data.max_wait_time.ns + lVar21);
    iVar17 = duckdb_je_nstime_compare(pnVar24,pnVar23);
    if (iVar17 < 0) {
      duckdb_je_nstime_copy(pnVar24,pnVar23);
    }
    plVar6 = (long *)((long)&pcVar11->bstats[0].mutex_data.n_wait_times + lVar21);
    lVar13 = plVar6[1];
    plVar8 = (long *)((long)&pcVar12->bstats[0].mutex_data.n_wait_times + lVar21);
    lVar14 = plVar8[1];
    plVar9 = (long *)((long)&pcVar12->bstats[0].mutex_data.n_wait_times + lVar21);
    *plVar9 = *plVar8 + *plVar6;
    plVar9[1] = lVar14 + lVar13;
    uVar10 = *(uint *)((long)&pcVar11->bstats[0].mutex_data.max_n_thds + lVar21);
    if (*(uint *)((long)&pcVar12->bstats[0].mutex_data.max_n_thds + lVar21) < uVar10) {
      *(uint *)((long)&pcVar12->bstats[0].mutex_data.max_n_thds + lVar21) = uVar10;
    }
    *(int *)((long)&pcVar12->bstats[0].mutex_data.n_waiting_thds.repr + lVar21) =
         *(int *)((long)&pcVar11->bstats[0].mutex_data.n_waiting_thds.repr + lVar21) +
         *(int *)((long)&pcVar12->bstats[0].mutex_data.n_waiting_thds.repr + lVar21);
    plVar6 = (long *)((long)&pcVar12->bstats[0].mutex_data.n_owner_switches + lVar21);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->bstats[0].mutex_data.n_owner_switches + lVar21);
    plVar6 = (long *)((long)&pcVar12->bstats[0].mutex_data.n_lock_ops + lVar21);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->bstats[0].mutex_data.n_lock_ops + lVar21);
    lVar21 = lVar21 + 0xb0;
  } while (lVar21 != 0x18c0);
  lVar21 = 0;
  do {
    plVar6 = (long *)((long)&pcVar12->lstats[0].nmalloc.val.repr + lVar21);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->lstats[0].nmalloc.val.repr + lVar21);
    plVar6 = (long *)((long)&pcVar12->lstats[0].ndalloc.val.repr + lVar21);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->lstats[0].ndalloc.val.repr + lVar21);
    plVar6 = (long *)((long)&pcVar12->lstats[0].nrequests.val.repr + lVar21);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->lstats[0].nrequests.val.repr + lVar21);
    if (!destroyed) {
      plVar6 = (long *)((long)&pcVar12->lstats[0].curlextents + lVar21);
      *plVar6 = *plVar6 + *(long *)((long)&pcVar11->lstats[0].curlextents + lVar21);
    }
    lVar21 = lVar21 + 0x30;
  } while (lVar21 != 0x24c0);
  lVar21 = 0;
  do {
    plVar6 = (long *)((long)&pcVar12->estats[0].nmuzzy + lVar21);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->estats[0].nmuzzy + lVar21);
    plVar6 = (long *)((long)&pcVar12->estats[0].nretained + lVar21);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->estats[0].nretained + lVar21);
    plVar6 = (long *)((long)&pcVar11->estats[0].ndirty + lVar21);
    lVar13 = plVar6[1];
    plVar8 = (long *)((long)&pcVar12->estats[0].ndirty + lVar21);
    lVar14 = plVar8[1];
    plVar9 = (long *)((long)&pcVar12->estats[0].ndirty + lVar21);
    *plVar9 = *plVar8 + *plVar6;
    plVar9[1] = lVar14 + lVar13;
    plVar6 = (long *)((long)&pcVar12->estats[0].muzzy_bytes + lVar21);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->estats[0].muzzy_bytes + lVar21);
    plVar6 = (long *)((long)&pcVar12->estats[0].retained_bytes + lVar21);
    *plVar6 = *plVar6 + *(long *)((long)&pcVar11->estats[0].retained_bytes + lVar21);
    lVar21 = lVar21 + 0x30;
  } while (lVar21 != 0x2550);
  duckdb_je_hpa_shard_stats_accum(&pcVar12->hpastats,&pcVar11->hpastats);
  (pcVar12->secstats).bytes = (pcVar12->secstats).bytes + (pcVar11->secstats).bytes;
  return;
}

Assistant:

static void
ctl_arena_refresh(tsdn_t *tsdn, arena_t *arena, ctl_arena_t *ctl_sdarena,
    unsigned i, bool destroyed) {
	ctl_arena_t *ctl_arena = arenas_i(i);

	ctl_arena_clear(ctl_arena);
	ctl_arena_stats_amerge(tsdn, ctl_arena, arena);
	/* Merge into sum stats as well. */
	ctl_arena_stats_sdmerge(ctl_sdarena, ctl_arena, destroyed);
}